

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdType.cpp
# Opt level: O3

void __thiscall ArrayId::ArrayId(ArrayId *this,string *name,TYPE et,int dim,period *prd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  
  local_50 = (size_type *)(name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50 == paVar1) {
    local_40 = paVar1->_M_allocated_capacity;
    uStack_38 = *(undefined8 *)((long)&name->field_2 + 8);
    local_50 = &local_40;
  }
  else {
    local_40 = paVar1->_M_allocated_capacity;
  }
  local_48 = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  (this->super_Id).name._M_dataplus._M_p = (pointer)&(this->super_Id).name.field_2;
  (this->super_Id).name._M_string_length = 0;
  (this->super_Id).name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&(this->super_Id).name,(string *)&local_50);
  (this->super_Id).type = _ARRAY;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  this->dim = dim;
  this->element_type = et;
  this->prd = prd;
  return;
}

Assistant:

ArrayId::ArrayId(std::string name, TYPE et, int dim, period *prd)
    : Id(std::move(name), _ARRAY) {
    this->dim = dim;
    this->element_type = et;
    this->prd = prd;
}